

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void LockWheelingWindow(ImGuiWindow *window,float wheel_amount)

{
  ImGuiContext *pIVar1;
  char *pcVar2;
  float fVar3;
  
  pIVar1 = GImGui;
  if (window == (ImGuiWindow *)0x0) {
    fVar3 = 0.0;
  }
  else {
    fVar3 = ABS(wheel_amount) * 0.7 + GImGui->WheelingWindowReleaseTimer;
    if (0.7 <= fVar3) {
      fVar3 = 0.7;
    }
  }
  GImGui->WheelingWindowReleaseTimer = fVar3;
  if (pIVar1->WheelingWindow != window) {
    if ((pIVar1->DebugLogFlags & 0x20) != 0) {
      if (window == (ImGuiWindow *)0x0) {
        pcVar2 = "NULL";
      }
      else {
        pcVar2 = window->Name;
      }
      ImGui::DebugLog("LockWheelingWindow() \"%s\"\n",pcVar2);
    }
    pIVar1->WheelingWindow = window;
    pIVar1->WheelingWindowRefMousePos = (pIVar1->IO).MousePos;
  }
  return;
}

Assistant:

static void LockWheelingWindow(ImGuiWindow* window, float wheel_amount)
{
    ImGuiContext& g = *GImGui;
    if (window)
        g.WheelingWindowReleaseTimer = ImMin(g.WheelingWindowReleaseTimer + ImAbs(wheel_amount) * WINDOWS_MOUSE_WHEEL_SCROLL_LOCK_TIMER, WINDOWS_MOUSE_WHEEL_SCROLL_LOCK_TIMER);
    else
        g.WheelingWindowReleaseTimer = 0.0f;
    if (g.WheelingWindow == window)
        return;
    IMGUI_DEBUG_LOG_IO("LockWheelingWindow() \"%s\"\n", window ? window->Name : "NULL");
    g.WheelingWindow = window;
    g.WheelingWindowRefMousePos = g.IO.MousePos;
}